

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O1

void __thiscall slang::ast::TypePrinter::appendMembers(TypePrinter *this,Scope *scope)

{
  iterator iVar1;
  uint uVar2;
  Type *type;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  iterator __begin2;
  iterator local_50;
  char *local_48;
  size_t local_40;
  
  ::fmt::v9::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"{","");
  if (scope->deferredMemberIndex != Invalid) {
    Scope::elaborate(scope);
  }
  local_50.current = scope->firstMember;
  if (local_50.current != (Symbol *)0x0) {
    do {
      iVar1.current = local_50.current;
      uVar2 = (local_50.current)->kind - Variable;
      if ((0x18 < uVar2) || ((0x1800c0fU >> (uVar2 & 0x1f) & 1) == 0)) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::VariableSymbol]")
        ;
      }
      type = DeclaredType::getType((DeclaredType *)(local_50.current + 1));
      append(this,type);
      local_40 = ((iVar1.current)->name)._M_len;
      local_48 = ((iVar1.current)->name)._M_str;
      fmt.size_ = 4;
      fmt.data_ = " {};";
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_48;
      args.desc_ = 0xd;
      ::fmt::v9::detail::vformat_to<char>
                ((buffer<char> *)
                 (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,args,
                 (locale_ref)0x0);
      Scope::iterator::operator++(&local_50);
    } while (local_50.current != (Symbol *)0x0);
  }
  ::fmt::v9::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"}","");
  return;
}

Assistant:

void TypePrinter::appendMembers(const Scope& scope) {
    buffer->append("{");
    for (auto& member : scope.members()) {
        auto& var = member.as<VariableSymbol>();
        append(var.getType());
        buffer->format(" {};", var.name);
    }
    buffer->append("}");
}